

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *
tinyusdz::lerp<tinyusdz::value::quath>
          (vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
           *__return_storage_ptr__,
          vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *a,
          vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_> *b,double t)

{
  ulong uVar1;
  quath qVar2;
  quath *extraout_RDX;
  quath *b_00;
  quath *extraout_RDX_00;
  ulong __new_size;
  long lVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (long)(a->
                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(a->
                super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>)
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  __new_size = (long)(b->
                     super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(b->
                     super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 3;
  if (uVar1 <= __new_size) {
    __new_size = uVar1;
  }
  if (__new_size != 0) {
    ::std::vector<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>::resize
              (__return_storage_ptr__,__new_size);
    if ((long)(a->
              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
              _M_impl.super__Vector_impl_data._M_start ==
        (long)(b->
              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(b->
              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>).
              _M_impl.super__Vector_impl_data._M_start) {
      lVar3 = 0;
      b_00 = extraout_RDX;
      do {
        qVar2 = lerp<tinyusdz::value::quath>
                          ((tinyusdz *)
                           ((long)&(((a->
                                     super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                     )._M_impl.super__Vector_impl_data._M_start)->imag)._M_elems[0].
                                   value + lVar3),
                           (quath *)((long)&(((b->
                                              super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->imag).
                                            _M_elems[0].value + lVar3),b_00,t);
        *(quath *)((long)&(((__return_storage_ptr__->
                            super__Vector_base<tinyusdz::value::quath,_std::allocator<tinyusdz::value::quath>_>
                            )._M_impl.super__Vector_impl_data._M_start)->imag)._M_elems[0].value +
                  lVar3) = qVar2;
        lVar3 = lVar3 + 8;
        __new_size = __new_size - 1;
        b_00 = extraout_RDX_00;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}